

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

gnode_t * parse_special_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer;
  gtoken_s token;
  gtoken_t gVar1;
  gnode_t *extraout_RAX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  char *local_20;
  
  lexer = parser->lexer->p[parser->lexer->n - 1];
  gVar1 = gravity_lexer_next(lexer);
  if (gVar1 == TOK_SPECIAL) {
    parse_identifier(parser);
    gravity_lexer_token(lexer);
    token.lineno = uStack_3c;
    token.type = local_40;
    token.colno = uStack_38;
    token.position = uStack_34;
    token.bytes = local_30;
    token.length = uStack_2c;
    token.fileid = uStack_28;
    token.builtin = uStack_24;
    token.value = local_20;
    report_error(parser,GRAVITY_WARNING,token,"%s",
                 "Unknown special token. Declaration will be ignored.",in_R8,in_R9);
    return extraout_RAX;
  }
  __assert_fail("type == TOK_SPECIAL",
                "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                ,0x9ab,"gnode_t *parse_special_statement(gravity_parser_t *)");
}

Assistant:

static gnode_t *parse_special_statement (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_special_statement");
    DECLARE_LEXER;

    // consume special @ symbol
    gtoken_t type = gravity_lexer_next(lexer);
    assert(type == TOK_SPECIAL);

    // special is really special so it has its own parser
    // because I don't want to mess standard syntax
    const char *specialid = parse_identifier(parser);
    if (specialid == NULL) goto handle_error;

handle_error:
    REPORT_WARNING(gravity_lexer_token(lexer), "%s", "Unknown special token. Declaration will be ignored.");
    return NULL;
}